

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall QFutureInterfaceBase::cleanContinuation(QFutureInterfaceBase *this)

{
  long lVar1;
  function<void_(const_QFutureInterfaceBase_&)> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QBasicMutex> lock;
  function<void_(const_QFutureInterfaceBase_&)> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)&(in_RDI->super__Function_base)._M_functor + 8) != 0) {
    this_00 = in_RDI;
    QMutexLocker<QBasicMutex>::QMutexLocker
              ((QMutexLocker<QBasicMutex> *)in_RDI,(QBasicMutex *)in_RDI);
    std::function<void_(const_QFutureInterfaceBase_&)>::operator=(this_00,in_RDI);
    std::atomic<QFutureInterfaceBasePrivate::ContinuationState>::operator=
              ((atomic<QFutureInterfaceBasePrivate::ContinuationState> *)this_00,
               (ContinuationState)((ulong)in_RDI >> 0x38));
    *(undefined8 *)(*(long *)((long)&(in_RDI->super__Function_base)._M_functor + 8) + 0xa8) = 0;
    QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::cleanContinuation()
{
    if (!d)
        return;

    QMutexLocker lock(&d->continuationMutex);
    d->continuation = nullptr;
    d->continuationState = QFutureInterfaceBasePrivate::Cleaned;
    d->continuationData = nullptr;
}